

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::GatherGeometryShader::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  GatherGeometryShader *this_local;
  
  local_18 = this;
  this_local = (GatherGeometryShader *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400                       \nin vec4 v_in_0;                    \nout vec4 d;                        \nvoid main() {                      \n   gl_Position = vec4(0, 0, 0, 1); \n   d = v_in_0;                     \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 400                       \n"
			   "in vec4 v_in_0;                    \n"
			   "out vec4 d;                        \n"
			   "void main() {                      \n"
			   "   gl_Position = vec4(0, 0, 0, 1); \n"
			   "   d = v_in_0;                     \n"
			   "}";
	}